

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_jh.c
# Opt level: O0

void F8(hashState *state)

{
  ulong uVar1;
  ulong uVar2;
  hashState *in_RDI;
  uint64 i;
  ulong local_10;
  
  for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
    in_RDI->x[local_10 >> 1][local_10 & 1] =
         *(ulong *)(in_RDI->buffer + local_10 * 8) ^ in_RDI->x[local_10 >> 1][local_10 & 1];
  }
  E8(in_RDI);
  for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
    uVar1 = local_10 + 8 >> 1;
    uVar2 = local_10 + 8 & 1;
    in_RDI->x[uVar1][uVar2] = *(ulong *)(in_RDI->buffer + local_10 * 8) ^ in_RDI->x[uVar1][uVar2];
  }
  return;
}

Assistant:

static void F8(hashState *state)
{
      uint64  i;

      /*xor the 512-bit message with the fist half of the 1024-bit hash state*/
      for (i = 0; i < 8; i++)  state->x[i >> 1][i & 1] ^= ((uint64*)state->buffer)[i];

      /*the bijective function E8 */
      E8(state);

      /*xor the 512-bit message with the second half of the 1024-bit hash state*/
      for (i = 0; i < 8; i++)  state->x[(8+i) >> 1][(8+i) & 1] ^= ((uint64*)state->buffer)[i];
}